

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hlslGrammar.cpp
# Opt level: O2

bool __thiscall glslang::HlslGrammar::acceptUnaryExpression(HlslGrammar *this,TIntermTyped **node)

{
  TArraySizes *pTVar1;
  bool bVar2;
  EHlslTokenClass op;
  TOperator op_00;
  TFunction *function;
  TIntermTyped *pTVar3;
  TSourceLoc loc_1;
  TIntermTyped *arguments;
  TArraySizes *arraySizes;
  TSourceLoc loc;
  
  bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokLeftParen);
  if (bVar2) {
    TType::TType((TType *)&loc,EbtVoid,EvqTemporary,1,0,0,false);
    bVar2 = acceptType(this,(TType *)&loc);
    if (!bVar2) {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      goto LAB_00334d1b;
    }
    arraySizes = (TArraySizes *)0x0;
    acceptArraySpecifier(this,&arraySizes);
    pTVar1 = arraySizes;
    loc_1.column = (this->super_HlslTokenStream).token.loc.column;
    loc_1._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    loc_1.name = (this->super_HlslTokenStream).token.loc.name;
    loc_1.string = (this->super_HlslTokenStream).token.loc.string;
    loc_1.line = (this->super_HlslTokenStream).token.loc.line;
    bVar2 = HlslTokenStream::acceptTokenClass(&this->super_HlslTokenStream,EHTokRightParen);
    if (!bVar2) {
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      HlslTokenStream::recedeToken(&this->super_HlslTokenStream);
      if (pTVar1 != (TArraySizes *)0x0) {
        (*(this->parseContext->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions
          [0x2d])(this->parseContext,&loc_1,"parenthesized array constructor not allowed","([]())",
                  "","");
      }
      goto LAB_00334c8e;
    }
    bVar2 = acceptUnaryExpression(this,node);
    if (!bVar2) {
      return false;
    }
    function = HlslParseContext::makeConstructorCall(this->parseContext,&loc_1,(TType *)&loc);
    if (function == (TFunction *)0x0) {
      expected(this,"type that can be constructed");
      return false;
    }
    arguments = (TIntermTyped *)0x0;
    HlslParseContext::handleFunctionArgument(this->parseContext,function,&arguments,*node);
    pTVar3 = HlslParseContext::handleFunctionCall(this->parseContext,&loc_1,function,arguments);
  }
  else {
LAB_00334c8e:
    op = HlslTokenStream::peek(&this->super_HlslTokenStream);
    op_00 = HlslOpMap::preUnary(op);
    if (op_00 == EOpNull) {
LAB_00334d1b:
      bVar2 = acceptPostfixExpression(this,node);
      return bVar2;
    }
    loc.column = (this->super_HlslTokenStream).token.loc.column;
    loc._20_4_ = *(undefined4 *)&(this->super_HlslTokenStream).token.loc.field_0x14;
    loc.name = (this->super_HlslTokenStream).token.loc.name;
    loc.string = (this->super_HlslTokenStream).token.loc.string;
    loc.line = (this->super_HlslTokenStream).token.loc.line;
    HlslTokenStream::advanceToken(&this->super_HlslTokenStream);
    bVar2 = acceptUnaryExpression(this,node);
    if (!bVar2) {
      return false;
    }
    if (op_00 == EOpAdd) {
      return true;
    }
    pTVar3 = TIntermediate::addUnaryMath(this->intermediate,op_00,*node,&loc);
    *node = pTVar3;
    if ((op_00 & ~EOpSequence) != EOpPreIncrement) goto LAB_00334d13;
    pTVar3 = HlslParseContext::handleLvalue(this->parseContext,&loc,"unary operator",node);
  }
  *node = pTVar3;
LAB_00334d13:
  return pTVar3 != (TIntermTyped *)0x0;
}

Assistant:

bool HlslGrammar::acceptUnaryExpression(TIntermTyped*& node)
{
    // (type) unary_expression
    // Have to look two steps ahead, because this could be, e.g., a
    // postfix_expression instead, since that also starts with at "(".
    if (acceptTokenClass(EHTokLeftParen)) {
        TType castType;
        if (acceptType(castType)) {
            // recognize any array_specifier as part of the type
            TArraySizes* arraySizes = nullptr;
            acceptArraySpecifier(arraySizes);
            if (arraySizes != nullptr)
                castType.transferArraySizes(arraySizes);
            TSourceLoc loc = token.loc;
            if (acceptTokenClass(EHTokRightParen)) {
                // We've matched "(type)" now, get the expression to cast
                if (! acceptUnaryExpression(node))
                    return false;

                // Hook it up like a constructor
                TFunction* constructorFunction = parseContext.makeConstructorCall(loc, castType);
                if (constructorFunction == nullptr) {
                    expected("type that can be constructed");
                    return false;
                }
                TIntermTyped* arguments = nullptr;
                parseContext.handleFunctionArgument(constructorFunction, arguments, node);
                node = parseContext.handleFunctionCall(loc, constructorFunction, arguments);

                return node != nullptr;
            } else {
                // This could be a parenthesized constructor, ala (int(3)), and we just accepted
                // the '(int' part.  We must back up twice.
                recedeToken();
                recedeToken();

                // Note, there are no array constructors like
                //   (float[2](...))
                if (arraySizes != nullptr)
                    parseContext.error(loc, "parenthesized array constructor not allowed", "([]())", "", "");
            }
        } else {
            // This isn't a type cast, but it still started "(", so if it is a
            // unary expression, it can only be a postfix_expression, so try that.
            // Back it up first.
            recedeToken();
            return acceptPostfixExpression(node);
        }
    }

    // peek for "op unary_expression"
    TOperator unaryOp = HlslOpMap::preUnary(peek());

    // postfix_expression (if no unary operator)
    if (unaryOp == EOpNull)
        return acceptPostfixExpression(node);

    // op unary_expression
    TSourceLoc loc = token.loc;
    advanceToken();
    if (! acceptUnaryExpression(node))
        return false;

    // + is a no-op
    if (unaryOp == EOpAdd)
        return true;

    node = intermediate.addUnaryMath(unaryOp, node, loc);

    // These unary ops require lvalues
    if (unaryOp == EOpPreIncrement || unaryOp == EOpPreDecrement)
        node = parseContext.handleLvalue(loc, "unary operator", node);

    return node != nullptr;
}